

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectAppearance.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::LinearObjectAppearance::SetOpacity(LinearObjectAppearance *this,KUINT8 O)

{
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  KUINT8 local_11;
  LinearObjectAppearance *pLStack_10;
  KUINT8 O_local;
  LinearObjectAppearance *this_local;
  
  if (100 < O) {
    local_11 = O;
    pLStack_10 = this;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"SetOpacity",&local_39);
    KException::KException<char_const*>(this_00,&local_38,8,"Acceptable values are 0-100.");
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  *(uint *)&(this->super_ObjectAppearance).field_0xc =
       *(uint *)&(this->super_ObjectAppearance).field_0xc & 0xffffff00 | (uint)O;
  return;
}

Assistant:

void LinearObjectAppearance::SetOpacity(KUINT8 O) noexcept(false)
{
    if( O > 100 ) throw KException( __FUNCTION__, INVALID_DATA, "Acceptable values are 0-100." );

    m_SpecificAppearanceUnion.m_ExhaustSmoke.m_ui32Opacity = O;
}